

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdMtlx.cc
# Opt level: O0

bool tinyusdz::ReadMaterialXFromFile
               (AssetResolutionResolver *resolver,string *asset_path,MtlxModel *mtlx,string *warn,
               string *err)

{
  bool bVar1;
  ulong uVar2;
  ostream *poVar3;
  reference pvVar4;
  size_type sVar5;
  allocator local_3f1;
  undefined1 local_3f0 [8];
  string str;
  ostringstream local_3b0 [8];
  ostringstream ss_e_1;
  undefined1 local_238 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  size_t max_bytes;
  string local_210 [32];
  string local_1f0 [32];
  ostringstream local_1d0 [8];
  ostringstream ss_e;
  undefined1 local_58 [8];
  string filepath;
  string *err_local;
  string *warn_local;
  MtlxModel *mtlx_local;
  string *asset_path_local;
  AssetResolutionResolver *resolver_local;
  
  filepath.field_2._8_8_ = err;
  AssetResolutionResolver::resolve((string *)local_58,resolver,asset_path);
  uVar2 = ::std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x1000000;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_238);
    bVar1 = io::ReadWholeFile((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_238,
                              (string *)filepath.field_2._8_8_,(string *)local_58,
                              (size_t)data.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage,(void *)0x0
                             );
    if (bVar1) {
      pvVar4 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_238,0);
      sVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_238);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)local_3f0,(char *)pvVar4,sVar5,&local_3f1);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_3f1);
      resolver_local._7_1_ =
           ReadMaterialXFromString
                     ((string *)local_3f0,asset_path,mtlx,warn,(string *)filepath.field_2._8_8_);
      ::std::__cxx11::string::~string((string *)local_3f0);
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream(local_3b0);
      poVar3 = ::std::operator<<((ostream *)local_3b0,"[error]");
      poVar3 = ::std::operator<<(poVar3,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdMtlx.cc"
                                );
      poVar3 = ::std::operator<<(poVar3,":");
      poVar3 = ::std::operator<<(poVar3,"ReadMaterialXFromFile");
      poVar3 = ::std::operator<<(poVar3,"():");
      poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x392);
      ::std::operator<<(poVar3," ");
      poVar3 = ::std::operator<<((ostream *)local_3b0,"Read file failed.");
      ::std::operator<<(poVar3,"\n");
      if (filepath.field_2._8_8_ != 0) {
        ::std::__cxx11::ostringstream::str();
        ::std::__cxx11::string::operator+=
                  ((string *)filepath.field_2._8_8_,(string *)(str.field_2._M_local_buf + 8));
        ::std::__cxx11::string::~string((string *)(str.field_2._M_local_buf + 8));
      }
      resolver_local._7_1_ = false;
      ::std::__cxx11::ostringstream::~ostringstream(local_3b0);
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_238);
  }
  else {
    ::std::__cxx11::ostringstream::ostringstream(local_1d0);
    poVar3 = ::std::operator<<((ostream *)local_1d0,"[error]");
    poVar3 = ::std::operator<<(poVar3,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdMtlx.cc"
                              );
    poVar3 = ::std::operator<<(poVar3,":");
    poVar3 = ::std::operator<<(poVar3,"ReadMaterialXFromFile");
    poVar3 = ::std::operator<<(poVar3,"():");
    poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x389);
    ::std::operator<<(poVar3," ");
    ::std::operator+((char *)local_1f0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     "Asset not found: ");
    poVar3 = ::std::operator<<((ostream *)local_1d0,local_1f0);
    ::std::operator<<(poVar3,"\n");
    ::std::__cxx11::string::~string(local_1f0);
    if (filepath.field_2._8_8_ != 0) {
      ::std::__cxx11::ostringstream::str();
      ::std::__cxx11::string::operator+=((string *)filepath.field_2._8_8_,local_210);
      ::std::__cxx11::string::~string(local_210);
    }
    resolver_local._7_1_ = false;
    ::std::__cxx11::ostringstream::~ostringstream(local_1d0);
  }
  ::std::__cxx11::string::~string((string *)local_58);
  return resolver_local._7_1_;
}

Assistant:

bool ReadMaterialXFromFile(const AssetResolutionResolver &resolver,
                           const std::string &asset_path, MtlxModel *mtlx,
                           std::string *warn, std::string *err) {
  std::string filepath = resolver.resolve(asset_path);
  if (filepath.empty()) {
    PUSH_ERROR_AND_RETURN("Asset not found: " + asset_path);
  }

  // up to 16MB xml
  size_t max_bytes = 1024 * 1024 * 16;

  std::vector<uint8_t> data;
  if (!io::ReadWholeFile(&data, err, filepath, max_bytes,
                         /* userdata */ nullptr)) {
    PUSH_ERROR_AND_RETURN("Read file failed.");
  }

  std::string str(reinterpret_cast<const char *>(&data[0]), data.size());
  return ReadMaterialXFromString(str, asset_path, mtlx, warn, err);
}